

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O1

double try_to_double(string *s)

{
  char *in_RAX;
  int *piVar1;
  double dVar2;
  undefined8 uVar3;
  int iVar4;
  char *pcVar5;
  char *local_28;
  
  local_28 = in_RAX;
  if (((2 < s->_M_string_length) && (pcVar5 = (s->_M_dataplus)._M_p, *pcVar5 == '0')) &&
     ((byte)(pcVar5[1] | 0x20U) == 0x78)) {
    piVar1 = __errno_location();
    iVar4 = *piVar1;
    *piVar1 = 0;
    dVar2 = (double)strtoull(pcVar5,&local_28,0x10);
    if (local_28 == pcVar5) goto LAB_00115897;
    if (*piVar1 == 0) {
      *piVar1 = iVar4;
      return dVar2;
    }
    if (*piVar1 != 0x22) {
      return dVar2;
    }
    pcVar5 = "stoull";
    std::__throw_out_of_range("stoull");
    s = (string *)pcVar5;
  }
  pcVar5 = (s->_M_dataplus)._M_p;
  piVar1 = __errno_location();
  iVar4 = *piVar1;
  *piVar1 = 0;
  dVar2 = strtod(pcVar5,&local_28);
  if (local_28 != pcVar5) {
    if (*piVar1 != 0) {
      if (*piVar1 != 0x22) {
        return dVar2;
      }
      dVar2 = (double)std::__throw_out_of_range("stod");
    }
    *piVar1 = iVar4;
    return dVar2;
  }
  std::__throw_invalid_argument("stod");
LAB_00115897:
  uVar3 = std::__throw_invalid_argument("stoull");
  if (*piVar1 == 0) {
    *piVar1 = iVar4;
  }
  _Unwind_Resume(uVar3);
}

Assistant:

inline double try_to_double(std::string s) {
    if (s.length() > 2 && s[0] == '0' && (s[1] == 'x' || s[1] == 'X')) {
        union {
            double d;
            std::uint64_t ll;
        } v;
        v.ll = static_cast<std::uint64_t>(std::stoull(s, 0, 16));
        return v.d;
    }
    else {
        return std::stod(s, 0);
    }
}